

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<flatbuffers::FlatBufferBuilderImpl<false>,_flatbuffers::FlatBufferBuilderImpl<false>_>
     ::all_tests(void)

{
  FlatBufferBuilderImpl<false> local_88;
  
  empty_builder_movector_test();
  nonempty_builder_movector_test();
  builder_movector_before_finish_test();
  builder_movector_after_finish_test();
  builder_move_assign_before_finish_test();
  builder_move_assign_after_finish_test();
  builder_move_assign_after_release_test();
  local_88.buf_.allocator_ = (Allocator *)0x0;
  local_88.buf_.own_allocator_ = false;
  local_88.buf_.initial_size_ = 0x400;
  local_88.buf_.max_size_ = 0x7fffffff;
  local_88.buf_.buffer_minalign_ = 8;
  local_88.buf_.reserved_ = 0;
  local_88.buf_.size_ = 0;
  local_88.length_of_64_bit_region_ = 0;
  local_88.nested = false;
  local_88.finished = false;
  local_88.buf_.buf_ = (uint8_t *)0x0;
  local_88.buf_.cur_._0_6_ = 0;
  local_88.buf_.cur_._6_2_ = 0;
  local_88.buf_.scratch_._0_6_ = 0;
  local_88._78_8_ = 0;
  local_88.minalign_ = 1;
  local_88.force_defaults_ = false;
  local_88.dedup_vtables_ = true;
  local_88.string_pool = (StringOffsetMap *)0x0;
  builder_move_assign_after_releaseraw_test<flatbuffers::FlatBufferBuilderImpl<false>>(&local_88);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_88);
  builder_swap_before_finish_test(true);
  builder_swap_after_finish_test(true);
  return;
}

Assistant:

static void all_tests() {
    empty_builder_movector_test();
    nonempty_builder_movector_test();
    builder_movector_before_finish_test();
    builder_movector_after_finish_test();
    builder_move_assign_before_finish_test();
    builder_move_assign_after_finish_test();
    builder_move_assign_after_release_test();
    builder_move_assign_after_releaseraw_test(DestBuilder());
    builder_swap_before_finish_test();
    builder_swap_after_finish_test();
  }